

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

Vec_Ptr_t * Scl_LibertyReadPinTimingAll(Scl_Tree_t *p,Scl_Item_t *pPinOut,char *pNameIn)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  char *__s1;
  Scl_Item_t *local_38;
  Scl_Item_t *pPinIn;
  Scl_Item_t *pTiming;
  Vec_Ptr_t *vTimings;
  char *pNameIn_local;
  Scl_Item_t *pPinOut_local;
  Scl_Tree_t *p_local;
  
  p_00 = Vec_PtrAlloc(0x10);
  for (pPinIn = Scl_LibertyItem(p,pPinOut->Child); pPinIn != (Scl_Item_t *)0x0;
      pPinIn = Scl_LibertyItem(p,pPinIn->Next)) {
    iVar1 = Scl_LibertyCompare(p,pPinIn->Key,"timing");
    if (iVar1 == 0) {
      for (local_38 = Scl_LibertyItem(p,pPinIn->Child); local_38 != (Scl_Item_t *)0x0;
          local_38 = Scl_LibertyItem(p,local_38->Next)) {
        iVar1 = Scl_LibertyCompare(p,local_38->Key,"related_pin");
        if (iVar1 == 0) {
          __s1 = Scl_LibertyReadString(p,local_38->Head);
          iVar1 = strcmp(__s1,pNameIn);
          if (iVar1 == 0) {
            Vec_PtrPush(p_00,pPinIn);
          }
        }
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Scl_LibertyReadPinTimingAll( Scl_Tree_t * p, Scl_Item_t * pPinOut, char * pNameIn )
{
    Vec_Ptr_t * vTimings;
    Scl_Item_t * pTiming, * pPinIn;
    vTimings = Vec_PtrAlloc( 16 );
    Scl_ItemForEachChildName( p, pPinOut, pTiming, "timing" )
        Scl_ItemForEachChildName( p, pTiming, pPinIn, "related_pin" )
            if ( !strcmp(Scl_LibertyReadString(p, pPinIn->Head), pNameIn) )
                Vec_PtrPush( vTimings, pTiming );
    return vTimings;
}